

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O1

lzma_ret delta_encode(lzma_coder_conflict4 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  lzma_code_function_conflict p_Var4;
  size_t sVar5;
  size_t sVar6;
  lzma_ret lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  
  p_Var4 = (coder->next).code;
  if (p_Var4 == (lzma_code_function_conflict)0x0) {
    sVar11 = *in_pos;
    sVar5 = *out_pos;
    uVar10 = out_size - sVar5;
    if (in_size - sVar11 < out_size - sVar5) {
      uVar10 = in_size - sVar11;
    }
    if (uVar10 != 0) {
      sVar6 = coder->distance;
      bVar9 = coder->pos;
      uVar12 = 0;
      do {
        bVar1 = (char)sVar6 + bVar9;
        uVar2 = in[uVar12 + sVar11];
        uVar8 = (ulong)bVar9;
        bVar9 = bVar9 - 1;
        uVar3 = coder->history[bVar1];
        coder->history[uVar8] = uVar2;
        out[uVar12 + sVar5] = uVar2 - uVar3;
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
      coder->pos = bVar9;
    }
    *in_pos = sVar11 + uVar10;
    *out_pos = sVar5 + uVar10;
    if (action == LZMA_RUN) {
      lVar7 = LZMA_OK;
    }
    else {
      lVar7 = (lzma_ret)(sVar11 + uVar10 == in_size);
    }
  }
  else {
    sVar11 = *out_pos;
    lVar7 = (*p_Var4)((lzma_coder_conflict *)(coder->next).coder,allocator,in,in_pos,in_size,out,
                      out_pos,out_size,action);
    sVar5 = *out_pos;
    if (sVar5 != sVar11) {
      sVar6 = coder->distance;
      bVar9 = coder->pos;
      do {
        bVar1 = (char)sVar6 + bVar9;
        uVar2 = out[sVar11];
        uVar10 = (ulong)bVar9;
        bVar9 = bVar9 - 1;
        uVar3 = coder->history[bVar1];
        coder->history[uVar10] = uVar2;
        out[sVar11] = uVar2 - uVar3;
        sVar11 = sVar11 + 1;
      } while (sVar5 != sVar11);
      coder->pos = bVar9;
    }
  }
  return lVar7;
}

Assistant:

static lzma_ret
delta_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}